

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::ShellCommand::configureAttribute
          (ShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *this_00;
  pointer *ppSVar1;
  pointer pSVar2;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  Twine *this_01;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  SmallString<4096U> wd;
  StringRef local_10e8;
  Child local_10d8;
  undefined8 local_10d0;
  Child local_10c8 [2];
  StringRef local_10b8;
  Twine local_10a8;
  Twine local_1090;
  Twine local_1078;
  Twine local_1060;
  Twine local_1048;
  Child local_1030;
  ulong uStack_1028;
  NodeKind local_1020;
  undefined7 uStack_101f;
  
  local_10e8.Length = value.Length;
  local_10e8.Data = value.Data;
  local_10b8.Length = name.Length;
  local_10b8.Data = name.Data;
  switch(local_10b8.Length) {
  case 4:
    if ((int)*(long *)local_10b8.Data == 0x73677261) {
      pSVar2 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_finish != pSVar2) {
        (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar2;
      }
      this_00 = &this->args;
      local_1030._0_4_ =
           (*ctx->delegate->_vptr_BuildFileDelegate[2])
                     (ctx->delegate,basic::DefaultShellPath_abi_cxx11_,DAT_00256fb8);
      local_1030._4_4_ = extraout_var;
      iVar3._M_current =
           (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(this_00,iVar3,(StringRef *)&local_1030);
      }
      else {
        (iVar3._M_current)->Data = (char *)local_1030;
        (iVar3._M_current)->Length = extraout_RDX;
        ppSVar1 = &(this->args).
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_1030._0_4_ = (*ctx->delegate->_vptr_BuildFileDelegate[2])(ctx->delegate,"-c",2);
      local_1030._4_4_ = extraout_var_00;
      iVar3._M_current =
           (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(this_00,iVar3,(StringRef *)&local_1030);
      }
      else {
        (iVar3._M_current)->Data = (char *)local_1030;
        (iVar3._M_current)->Length = extraout_RDX_00;
        ppSVar1 = &(this->args).
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_1030._0_4_ =
           (*ctx->delegate->_vptr_BuildFileDelegate[2])
                     (ctx->delegate,local_10e8.Data,local_10e8.Length);
      local_1030._4_4_ = extraout_var_01;
      iVar3._M_current =
           (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(this_00,iVar3,(StringRef *)&local_1030);
      }
      else {
        (iVar3._M_current)->Data = (char *)local_1030;
        (iVar3._M_current)->Length = extraout_RDX_01;
        ppSVar1 = &(this->args).
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    else {
      if ((int)*(long *)local_10b8.Data != 0x73706564) goto switchD_00177f95_caseD_5;
      llvm::
      SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::clear(&(this->depsPaths).
               super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
      llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>
                ((SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths,&local_10e8);
    }
    break;
  default:
switchD_00177f95_caseD_5:
    bVar4 = ExternalCommand::configureAttribute(&this->super_ExternalCommand,ctx,name,value);
    return bVar4;
  case 9:
    if ((char)*(long *)((long)local_10b8.Data + 8) != 'e' ||
        *(long *)local_10b8.Data != 0x727574616e676973) goto switchD_00177f95_caseD_5;
    local_1030.twine = (Twine *)&local_1020;
    if ((long *)local_10e8.Data == (long *)0x0) {
      uStack_1028 = 0;
      local_1020 = NullKind;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1030,local_10e8.Data,local_10e8.Length + (long)local_10e8.Data);
    }
    std::__cxx11::string::operator=((string *)&this->signatureData,(string *)&local_1030.character);
    if (local_1030.twine != (Twine *)&local_1020) {
      operator_delete(local_1030.twine,CONCAT71(uStack_101f,local_1020) + 1);
    }
    break;
  case 10:
    if ((short)*(long *)((long)local_10b8.Data + 8) != 0x656c ||
        *(long *)local_10b8.Data != 0x7974732d73706564) goto switchD_00177f95_caseD_5;
    if (local_10e8.Length == 0x24) {
      iVar5 = bcmp(local_10e8.Data,"makefile-ignoring-subsequent-outputs",0x24);
      if (iVar5 == 0) {
        this->depsStyle = MakefileIgnoringSubsequentOutputs;
        return true;
      }
    }
    else if (local_10e8.Length == 0xf) {
      if (*(long *)((long)local_10e8.Data + 7) == 0x6f666e692d79636e &&
          *(long *)local_10e8.Data == 0x6e65646e65706564) {
        this->depsStyle = DependencyInfo;
        return true;
      }
    }
    else if ((local_10e8.Length == 8) && (*(long *)local_10e8.Data == 0x656c6966656b616d)) {
      this->depsStyle = Makefile;
      return true;
    }
    llvm::Twine::Twine((Twine *)&local_10d8,"unknown \'deps-style\': \'",&local_10e8);
    this_01 = &local_10a8;
    llvm::Twine::Twine(this_01,"\'");
    goto LAB_00178576;
  case 0xb:
    if (*(long *)((long)local_10b8.Data + 3) != 0x766e652d74697265 ||
        *(long *)local_10b8.Data != 0x2d74697265686e69) goto switchD_00177f95_caseD_5;
    if (local_10e8.Length == 5) {
      if (*(char *)((long)local_10e8.Data + 4) != 'e' || (int)*(long *)local_10e8.Data != 0x736c6166
         ) goto LAB_00178462;
      bVar4 = false;
    }
    else {
      if ((local_10e8.Length != 4) || ((int)*(long *)local_10e8.Data != 0x65757274))
      goto LAB_00178462;
      bVar4 = true;
    }
    this->inheritEnv = bVar4;
    break;
  case 0xf:
    if (*(long *)((long)local_10b8.Data + 7) != 0x64656c62616e652d ||
        *(long *)local_10b8.Data != 0x2d6c6f72746e6f63) goto switchD_00177f95_caseD_5;
    if (local_10e8.Length == 5) {
      if (*(char *)((long)local_10e8.Data + 4) == 'e' && (int)*(long *)local_10e8.Data == 0x736c6166
         ) {
        bVar4 = false;
        goto LAB_0017858c;
      }
    }
    else if ((local_10e8.Length == 4) && ((int)*(long *)local_10e8.Data == 0x65757274)) {
      bVar4 = true;
LAB_0017858c:
      this->controlEnabled = bVar4;
      return true;
    }
    goto LAB_00178462;
  case 0x11:
    auVar6[0] = -((char)*(long *)local_10b8.Data == 'w');
    auVar6[1] = -(*(char *)((long)local_10b8.Data + 1) == 'o');
    auVar6[2] = -(*(char *)((long)local_10b8.Data + 2) == 'r');
    auVar6[3] = -(*(char *)((long)local_10b8.Data + 3) == 'k');
    auVar6[4] = -(*(char *)((long)local_10b8.Data + 4) == 'i');
    auVar6[5] = -(*(char *)((long)local_10b8.Data + 5) == 'n');
    auVar6[6] = -(*(char *)((long)local_10b8.Data + 6) == 'g');
    auVar6[7] = -(*(char *)((long)local_10b8.Data + 7) == '-');
    auVar6[8] = -((char)*(long *)((long)local_10b8.Data + 8) == 'd');
    auVar6[9] = -(*(char *)((long)local_10b8.Data + 9) == 'i');
    auVar6[10] = -(*(char *)((long)local_10b8.Data + 10) == 'r');
    auVar6[0xb] = -(*(char *)((long)local_10b8.Data + 0xb) == 'e');
    auVar6[0xc] = -(*(char *)((long)local_10b8.Data + 0xc) == 'c');
    auVar6[0xd] = -(*(char *)((long)local_10b8.Data + 0xd) == 't');
    auVar6[0xe] = -(*(char *)((long)local_10b8.Data + 0xe) == 'o');
    auVar6[0xf] = -(*(char *)((long)local_10b8.Data + 0xf) == 'r');
    auVar8[0] = -((char)*(long *)((long)local_10b8.Data + 0x10) == 'y');
    auVar8[1] = 0xff;
    auVar8[2] = 0xff;
    auVar8[3] = 0xff;
    auVar8[4] = 0xff;
    auVar8[5] = 0xff;
    auVar8[6] = 0xff;
    auVar8[7] = 0xff;
    auVar8[8] = 0xff;
    auVar8[9] = 0xff;
    auVar8[10] = 0xff;
    auVar8[0xb] = 0xff;
    auVar8[0xc] = 0xff;
    auVar8[0xd] = 0xff;
    auVar8[0xe] = 0xff;
    auVar8[0xf] = 0xff;
    auVar8 = auVar8 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff) goto switchD_00177f95_caseD_5;
    uStack_1028 = 0x100000000000;
    local_1030.twine = (Twine *)&local_1020;
    llvm::SmallVectorImpl<char>::append<char_const*,void>
              ((SmallVectorImpl<char> *)&local_1030,local_10e8.Data,
               (char *)(local_10e8.Length + (long)local_10e8.Data));
    llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)&local_1030);
    if (local_1030.twine == (Twine *)0x0) {
      local_10d8.twine = (Twine *)local_10c8;
      local_10d0 = 0;
      local_10c8[0].character = '\0';
    }
    else {
      local_10d8.twine = (Twine *)local_10c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_10d8,local_1030.twine,
                 (byte *)((long)&(local_1030.twine)->LHS + (uStack_1028 & 0xffffffff)));
    }
    std::__cxx11::string::operator=
              ((string *)&this->workingDirectory,(string *)&local_10d8.character);
    if (&(local_10d8.twine)->LHS != local_10c8) {
      operator_delete(local_10d8.twine,CONCAT71(local_10c8[0]._1_7_,local_10c8[0].character) + 1);
    }
    if (local_1030.twine != (Twine *)&local_1020) {
      free(local_1030.twine);
    }
    break;
  case 0x14:
    iVar5 = (int)*(long *)((long)local_10b8.Data + 0x10);
    auVar9[0] = -((char)iVar5 == 'r');
    auVar9[1] = -((char)((uint)iVar5 >> 8) == 'u');
    auVar9[2] = -((char)((uint)iVar5 >> 0x10) == 'p');
    auVar9[3] = -((char)((uint)iVar5 >> 0x18) == 't');
    auVar9[4] = 0xff;
    auVar9[5] = 0xff;
    auVar9[6] = 0xff;
    auVar9[7] = 0xff;
    auVar9[8] = 0xff;
    auVar9[9] = 0xff;
    auVar9[10] = 0xff;
    auVar9[0xb] = 0xff;
    auVar9[0xc] = 0xff;
    auVar9[0xd] = 0xff;
    auVar9[0xe] = 0xff;
    auVar9[0xf] = 0xff;
    auVar7[0] = -((char)*(long *)local_10b8.Data == 'c');
    auVar7[1] = -(*(char *)((long)local_10b8.Data + 1) == 'a');
    auVar7[2] = -(*(char *)((long)local_10b8.Data + 2) == 'n');
    auVar7[3] = -(*(char *)((long)local_10b8.Data + 3) == '-');
    auVar7[4] = -(*(char *)((long)local_10b8.Data + 4) == 's');
    auVar7[5] = -(*(char *)((long)local_10b8.Data + 5) == 'a');
    auVar7[6] = -(*(char *)((long)local_10b8.Data + 6) == 'f');
    auVar7[7] = -(*(char *)((long)local_10b8.Data + 7) == 'e');
    auVar7[8] = -((char)*(long *)((long)local_10b8.Data + 8) == 'l');
    auVar7[9] = -(*(char *)((long)local_10b8.Data + 9) == 'y');
    auVar7[10] = -(*(char *)((long)local_10b8.Data + 10) == '-');
    auVar7[0xb] = -(*(char *)((long)local_10b8.Data + 0xb) == 'i');
    auVar7[0xc] = -(*(char *)((long)local_10b8.Data + 0xc) == 'n');
    auVar7[0xd] = -(*(char *)((long)local_10b8.Data + 0xd) == 't');
    auVar7[0xe] = -(*(char *)((long)local_10b8.Data + 0xe) == 'e');
    auVar7[0xf] = -(*(char *)((long)local_10b8.Data + 0xf) == 'r');
    auVar7 = auVar7 & auVar9;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff) goto switchD_00177f95_caseD_5;
    if (local_10e8.Length == 5) {
      if (*(char *)((long)local_10e8.Data + 4) == 'e' && (int)*(long *)local_10e8.Data == 0x736c6166
         ) {
        bVar4 = false;
        goto LAB_0017841c;
      }
    }
    else if ((local_10e8.Length == 4) && ((int)*(long *)local_10e8.Data == 0x65757274)) {
      bVar4 = true;
LAB_0017841c:
      this->canSafelyInterrupt = bVar4;
      return true;
    }
LAB_00178462:
    llvm::Twine::Twine(&local_1048,"invalid value: \'",&local_10e8);
    llvm::Twine::Twine(&local_1060,"\' for attribute \'");
    llvm::operator+(&local_10a8,&local_1048,&local_1060);
    llvm::Twine::Twine(&local_1078,&local_10b8);
    llvm::operator+((Twine *)&local_10d8,&local_10a8,&local_1078);
    this_01 = &local_1090;
    llvm::Twine::Twine(this_01,"\'");
LAB_00178576:
    llvm::operator+((Twine *)&local_1030,(Twine *)&local_10d8,this_01);
    ConfigureContext::error(ctx,(Twine *)&local_1030);
    return false;
  }
  return true;
}

Assistant:

bool ShellCommand::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                      StringRef value) {
  if (name == "args") {
    // When provided as a scalar string, we default to executing using the
    // shell.
    args.clear();
#if defined(_WIN32)
    args.push_back(ctx.getDelegate().getInternedString(
                       "C:\\windows\\system32\\cmd.exe"));
    args.push_back(ctx.getDelegate().getInternedString("/C"));
#else
    args.push_back(ctx.getDelegate().getInternedString(DefaultShellPath));
    args.push_back(ctx.getDelegate().getInternedString("-c"));
#endif
    args.push_back(ctx.getDelegate().getInternedString(value));
  } else if (name == "signature") {
    signatureData = value;
  } else if (name == "deps") {
    depsPaths.clear();
    depsPaths.emplace_back(value);
  } else if (name == "deps-style") {
    if (value == "makefile") {
      depsStyle = DepsStyle::Makefile;
    } else if (value == "dependency-info") {
      depsStyle = DepsStyle::DependencyInfo;
    } else if (value == "makefile-ignoring-subsequent-outputs") {
      depsStyle = DepsStyle::MakefileIgnoringSubsequentOutputs;
    } else {
      ctx.error("unknown 'deps-style': '" + value + "'");
      return false;
    }
    return true;
  } else if (name == "can-safely-interrupt") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    canSafelyInterrupt = value == "true";
  } else if (name == "inherit-env") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    inheritEnv = value == "true";
  } else if (name == "working-directory") {
    // Ensure the working directory is absolute. This will make sure any
    // relative directories are interpreted as relative to the CWD at the time
    // the rule is defined.
    SmallString<PATH_MAX> wd = value;
    llvm::sys::fs::make_absolute(wd);
    workingDirectory = StringRef(wd);
  } else if (name == "control-enabled") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    controlEnabled = value == "true";
  } else {
    return ExternalCommand::configureAttribute(ctx, name, value);
  }

  return true;
}